

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O2

QNonContiguousByteDevice * __thiscall
QNetworkReplyHttpImplPrivate::createUploadByteDevice(QNetworkReplyHttpImplPrivate *this)

{
  char *pcVar1;
  __shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  QNonContiguousByteDevice *pQVar3;
  long in_FS_OFFSET;
  QObject local_50 [8];
  __shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = *(char **)&(this->super_QNetworkReplyPrivate).field_0x8;
  if ((this->outgoingDataBuffer).super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    if (this->outgoingData == (QIODevice *)0x0) {
      pQVar3 = (QNonContiguousByteDevice *)0x0;
      goto LAB_001fffa2;
    }
    QNonContiguousByteDeviceFactory::createShared((QIODevice *)&local_38);
    std::__shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->uploadByteDevice).
                super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2> *)&local_38);
    p_Var2 = &local_38;
  }
  else {
    std::__shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_48,
               &(this->outgoingDataBuffer).
                super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>);
    QNonContiguousByteDeviceFactory::createShared(&local_38,&local_48);
    std::__shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->uploadByteDevice).
                super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2> *)&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    p_Var2 = &local_48;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var2->_M_refcount);
  if (this->synchronous == false) {
    QObject::connect(local_50,(char *)(this->uploadByteDevice).
                                      super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,(QObject *)"2readProgress(qint64,qint64)",pcVar1,
                     0x250c36);
    QMetaObject::Connection::~Connection((Connection *)local_50);
  }
  pQVar3 = (this->uploadByteDevice).
           super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_001fffa2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QNonContiguousByteDevice* QNetworkReplyHttpImplPrivate::createUploadByteDevice()
{
    Q_Q(QNetworkReplyHttpImpl);

    if (outgoingDataBuffer)
        uploadByteDevice = QNonContiguousByteDeviceFactory::createShared(outgoingDataBuffer);
    else if (outgoingData) {
        uploadByteDevice = QNonContiguousByteDeviceFactory::createShared(outgoingData);
    } else {
        return nullptr;
    }

    // We want signal emissions only for normal asynchronous uploads
    if (!synchronous)
        QObject::connect(uploadByteDevice.get(), SIGNAL(readProgress(qint64,qint64)),
                         q, SLOT(emitReplyUploadProgress(qint64,qint64)));

    return uploadByteDevice.get();
}